

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::EndTabItem(void)

{
  ImGuiTabBar *this;
  ImGuiTabItem *pIVar1;
  ImGuiTabItem *tab;
  ImGuiTabBar *tab_bar;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  if ((GImGui->CurrentWindow->SkipItems & 1U) == 0) {
    this = GImGui->CurrentTabBar;
    if (this == (ImGuiTabBar *)0x0) {
      __assert_fail("(tab_bar != __null) && \"Needs to be called between BeginTabBar() and EndTabBar()!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                    ,0x1e0b,"void ImGui::EndTabItem()");
    }
    if (this->LastTabItemIdx < 0) {
      __assert_fail("tab_bar->LastTabItemIdx >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                    ,0x1e0e,"void ImGui::EndTabItem()");
    }
    pIVar1 = ImVector<ImGuiTabItem>::operator[](&this->Tabs,(int)this->LastTabItemIdx);
    if ((pIVar1->Flags & 8U) == 0) {
      PopID();
    }
  }
  return;
}

Assistant:

void    ImGui::EndTabItem()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT_USER_ERROR(tab_bar != NULL, "Needs to be called between BeginTabBar() and EndTabBar()!");
        return;
    }
    IM_ASSERT(tab_bar->LastTabItemIdx >= 0);
    ImGuiTabItem* tab = &tab_bar->Tabs[tab_bar->LastTabItemIdx];
    if (!(tab->Flags & ImGuiTabItemFlags_NoPushId))
        PopID();
}